

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O3

void __thiscall tchecker::if_statement_t::output(if_statement_t *this)

{
  ostream *in_RSI;
  
  output((if_statement_t *)(&this->field_0x0 + *(long *)(*(long *)this + -0x30)),in_RSI);
  return;
}

Assistant:

std::ostream & if_statement_t::output(std::ostream & os) const
{
  os << "if ";
  _condition->output(os);
  os <<  " then ";
  _then_stmt->output(os);
  os << " else ";
  _else_stmt->output(os);
  os  << " endif";
  return os;
}